

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::FdConnectionReceiver::getsockopt
          (FdConnectionReceiver *this,int __fd,int __level,int __optname,void *__optval,
          socklen_t *__optlen)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_60;
  Fault f;
  SyscallResult local_30;
  undefined4 local_2c;
  SyscallResult _kjSyscallResult;
  socklen_t socklen;
  uint *length_local;
  void *value_local;
  int option_local;
  int level_local;
  FdConnectionReceiver *this_local;
  
  local_2c = *__optval;
  f.exception = (Exception *)this;
  __kjSyscallResult = (undefined4 *)__optval;
  local_30 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::FdConnectionReceiver::getsockopt(int,int,void*,unsigned_int*)::_lambda()_1_>
                       ((anon_class_40_5_ebb679db *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_30);
  if (pvVar1 != (void *)0x0) {
    *__kjSyscallResult = local_2c;
    return (int)__kjSyscallResult;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_30);
  kj::_::Debug::Fault::Fault
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x58c,osErrorNumber,"::getsockopt(fd, level, option, value, &socklen)","");
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

void getsockopt(int level, int option, void* value, uint* length) override {
    socklen_t socklen = *length;
    KJ_SYSCALL(::getsockopt(fd, level, option, value, &socklen));
    *length = socklen;
  }